

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O2

int glfwJoystickIsGamepad(int jid)

{
  ulong uVar1;
  GLFWbool GVar2;
  uint uVar3;
  
  if (jid < 0) {
    __assert_fail("jid >= GLFW_JOYSTICK_1",
                  "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                  ,0x521,"int glfwJoystickIsGamepad(int)");
  }
  uVar1 = (ulong)(uint)jid;
  if ((uint)jid < 0x10) {
    if (_glfw.initialized == 0) {
      uVar3 = 0;
      _glfwInputError(0x10001,(char *)0x0);
    }
    else {
      GVar2 = initJoysticks();
      uVar3 = 0;
      if ((GVar2 != 0) && (_glfw.joysticks[uVar1].connected != 0)) {
        uVar3 = 0;
        GVar2 = (*_glfw.platform.pollJoystick)((_GLFWjoystick *)(uVar1 * 0x2018 + 0x1993b8),0);
        if (GVar2 != 0) {
          uVar3 = (uint)(_glfw.joysticks[uVar1].mapping != (_GLFWmapping *)0x0);
        }
      }
    }
    return uVar3;
  }
  __assert_fail("jid <= GLFW_JOYSTICK_LAST",
                "/workspace/llm4binary/github/license_c_cmakelists/karimnaaji[P]live-glsl/deps/glfw/src/input.c"
                ,0x522,"int glfwJoystickIsGamepad(int)");
}

Assistant:

GLFWAPI int glfwJoystickIsGamepad(int jid)
{
    _GLFWjoystick* js;

    assert(jid >= GLFW_JOYSTICK_1);
    assert(jid <= GLFW_JOYSTICK_LAST);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    if (jid < 0 || jid > GLFW_JOYSTICK_LAST)
    {
        _glfwInputError(GLFW_INVALID_ENUM, "Invalid joystick ID %i", jid);
        return GLFW_FALSE;
    }

    if (!initJoysticks())
        return GLFW_FALSE;

    js = _glfw.joysticks + jid;
    if (!js->connected)
        return GLFW_FALSE;

    if (!_glfw.platform.pollJoystick(js, _GLFW_POLL_PRESENCE))
        return GLFW_FALSE;

    return js->mapping != NULL;
}